

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ggml.c
# Opt level: O1

ggml_tensor * ggml_cross_entropy_loss(ggml_context *ctx,ggml_tensor *a,ggml_tensor *b)

{
  ggml_tensor *pgVar1;
  int64_t local_18;
  
  if ((((a->ne[0] == b->ne[0]) && (a->ne[1] == b->ne[1])) && (a->ne[2] == b->ne[2])) &&
     (a->ne[3] == b->ne[3])) {
    local_18 = 1;
    pgVar1 = ggml_new_tensor_impl(ctx,a->type,1,&local_18,(ggml_tensor *)0x0,0);
    pgVar1->op = GGML_OP_CROSS_ENTROPY_LOSS;
    pgVar1->src[0] = a;
    pgVar1->src[1] = b;
    return pgVar1;
  }
  ggml_abort("/workspace/llm4binary/github/license_c_cmakelists/ggerganov[P]whisper/ggml/src/ggml.c"
             ,0x13eb,"GGML_ASSERT(%s) failed","ggml_are_same_shape(a, b)");
}

Assistant:

struct ggml_tensor * ggml_cross_entropy_loss(
        struct ggml_context * ctx,
        struct ggml_tensor  * a,
        struct ggml_tensor  * b) {
    GGML_ASSERT(ggml_are_same_shape(a, b));

    struct ggml_tensor * result = ggml_new_tensor_1d(ctx, a->type, 1);

    result->op     = GGML_OP_CROSS_ENTROPY_LOSS;
    result->src[0] = a;
    result->src[1] = b;

    return result;
}